

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_TryMove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  AActor *thing;
  DVector2 local_38;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0041df83;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    thing = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (thing != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0041df83;
        }
        goto LAB_0041dedf;
      }
    }
    else if (thing != (AActor *)0x0) goto LAB_0041df73;
    thing = (AActor *)0x0;
LAB_0041dedf:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar2 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\0') {
                local_38.X = (double)param[1].field_0.field_1.a;
                local_38.Y = (double)param[2].field_0.field_1.a;
                iVar3 = 0;
                bVar1 = P_TryMove(thing,&local_38,param[3].field_0.i,(secplane_t *)0x0);
                if (0 < numret) {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                  ,0xa45,
                                  "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  VMReturn::SetInt(ret,(uint)bVar1);
                  iVar3 = 1;
                }
                return iVar3;
              }
              pcVar2 = "param[paramnum].Type == REGT_INT";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                          ,0xa44,
                          "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar2 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0xa43,
                      "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar2 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0xa42,"int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0041df73:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0041df83:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0xa41,"int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TryMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_INT(dropoff);
	ACTION_RETURN_BOOL(P_TryMove(self, DVector2(x, y), dropoff));
}